

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O2

object_ptr __thiscall
mjs::native_error_exception::make_error_object
          (native_error_exception *this,gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap *h;
  void *pvVar1;
  long *plVar2;
  char *pcVar3;
  long *plVar4;
  gc_heap_ptr_untyped *in_RDX;
  undefined8 extraout_RDX;
  object_ptr oVar5;
  gc_heap_ptr_untyped local_90;
  gc_heap_ptr_untyped local_80;
  gc_heap_ptr<mjs::error_object> eo;
  value local_60;
  wstring_view local_38;
  
  pvVar1 = gc_heap_ptr_untyped::get(in_RDX);
  h = *(gc_heap **)((long)pvVar1 + 8);
  plVar2 = (long *)gc_heap_ptr_untyped::get(in_RDX);
  pcVar3 = type_string(*(native_error_type *)&global[1].super_gc_heap_ptr_untyped.heap_);
  (**(code **)(*plVar2 + 0x98))(&local_60,plVar2,pcVar3);
  plVar2 = (long *)gc_heap_ptr_untyped::get(in_RDX);
  (**(code **)(*plVar2 + 0x80))
            (&local_80,plVar2,
             *(undefined4 *)
              &(((string *)(global + 1))->super_gc_heap_ptr<mjs::gc_string>).
               super_gc_heap_ptr_untyped.heap_);
  local_38._M_str = *(wchar_t **)&global[3].super_gc_heap_ptr_untyped.pos_;
  local_38._M_len = (size_t)global[4].super_gc_heap_ptr_untyped.heap_;
  string::string((string *)&local_90,h,&local_38);
  gc_heap::
  make<mjs::error_object,mjs::native_error_type_const&,mjs::string,mjs::gc_heap_ptr<mjs::object>,mjs::string>
            ((gc_heap *)&eo,(native_error_type *)h,(string *)(global + 1),
             (gc_heap_ptr<mjs::object> *)&local_60,(string *)&local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_60);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&eo.super_gc_heap_ptr_untyped);
  plVar4 = (long *)gc_heap_ptr_untyped::get(in_RDX);
  (**(code **)(*plVar4 + 0x98))(&local_80,plVar4,"message");
  local_38._M_str = *(wchar_t **)&global[1].super_gc_heap_ptr_untyped.pos_;
  local_38._M_len = (size_t)global[2].super_gc_heap_ptr_untyped.heap_;
  string::string((string *)&local_90,h,&local_38);
  value::value(&local_60,(string *)&local_90);
  (**(code **)(*plVar2 + 8))(plVar2,&local_80,&local_60,6);
  value::~value(&local_60);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)this,&eo.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&eo.super_gc_heap_ptr_untyped);
  oVar5.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar5.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar5.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr native_error_exception::make_error_object(const gc_heap_ptr<global_object>& global) const {
    auto& h = global->heap();
    auto eo = h.make<error_object>(type_, global->common_string(type_string(type_)), global->error_prototype(type_), string{h, stack_trace_});
    eo->put(global->common_string("message"), value{string{h, msg_}}, message_attributes);
    return eo;
}